

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *name;
  char *in_RDX;
  long in_FS_OFFSET;
  char *local_70;
  char *value;
  char *default_value_local;
  char *flag_local;
  string env_var;
  
  env_var.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  FlagToEnvVar_abi_cxx11_((string *)&flag_local,(internal *)flag,in_RDX);
  name = (char *)std::__cxx11::string::c_str();
  local_70 = posix::GetEnv(name);
  if (local_70 == (char *)0x0) {
    local_70 = default_value;
  }
  std::__cxx11::string::~string((string *)&flag_local);
  if (*(long *)(in_FS_OFFSET + 0x28) != env_var.field_2._8_8_) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}